

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaPoolAllocator<VmaAllocation_T>::Free
          (VmaPoolAllocator<VmaAllocation_T> *this,VmaAllocation_T *ptr)

{
  Item *pIVar1;
  ItemBlock *pIVar2;
  size_t index_00;
  Item *in_RSI;
  long in_RDI;
  uint32_t index;
  Item *pItemPtr;
  ItemBlock *block;
  size_t i;
  size_t local_18;
  
  local_18 = VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
             ::size((VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
                     *)(in_RDI + 0x10));
  do {
    index_00 = local_18 - 1;
    if (local_18 == 0) {
      return;
    }
    pIVar2 = VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
             ::operator[]((VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
                           *)(in_RDI + 0x10),index_00);
    local_18 = index_00;
  } while ((in_RSI < pIVar2->pItems) || (pIVar2->pItems + pIVar2->Capacity <= in_RSI));
  VmaAllocation_T::~VmaAllocation_T((VmaAllocation_T *)in_RSI);
  pIVar1 = pIVar2->pItems;
  in_RSI->NextFreeIndex = pIVar2->FirstFreeIndex;
  pIVar2->FirstFreeIndex = (uint32_t)(((long)in_RSI - (long)pIVar1) / 0x58);
  return;
}

Assistant:

void VmaPoolAllocator<T>::Free(T* ptr)
{
    // Search all memory blocks to find ptr.
    for (size_t i = m_ItemBlocks.size(); i--; )
    {
        ItemBlock& block = m_ItemBlocks[i];

        // Casting to union.
        Item* pItemPtr;
        memcpy(&pItemPtr, &ptr, sizeof(pItemPtr));

        // Check if pItemPtr is in address range of this block.
        if ((pItemPtr >= block.pItems) && (pItemPtr < block.pItems + block.Capacity))
        {
            ptr->~T(); // Explicit destructor call.
            const uint32_t index = static_cast<uint32_t>(pItemPtr - block.pItems);
            pItemPtr->NextFreeIndex = block.FirstFreeIndex;
            block.FirstFreeIndex = index;
            return;
        }
    }
    VMA_ASSERT(0 && "Pointer doesn't belong to this memory pool.");
}